

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

quatf tinyusdz::to_quaternion(float3 *axis,float angle)

{
  double dVar1;
  double dVar2;
  float fVar3;
  quatf qVar4;
  
  dVar1 = ((double)angle * 0.5) / 180.0;
  dVar2 = math::sin_pi_imp<double>(dVar1);
  fVar3 = (float)dVar2;
  dVar1 = math::cos_pi_imp<double>(dVar1);
  qVar4.imag._M_elems[0] = fVar3 * (float)*(undefined8 *)axis->_M_elems;
  qVar4.imag._M_elems[1] = fVar3 * (float)((ulong)*(undefined8 *)axis->_M_elems >> 0x20);
  qVar4.real = (float)dVar1;
  qVar4.imag._M_elems[2] = fVar3 * axis->_M_elems[2];
  return qVar4;
}

Assistant:

value::quatf to_quaternion(const value::float3 &axis, const float angle) {

  // Use sin_pi and cos_pi for better accuracy.
  float s = float(math::sin_pi(double(angle)/2.0/180.0));
  float c = float(math::cos_pi(double(angle)/2.0/180.0));

  value::quatf q;
  q.imag[0] = axis[0] * s;
  q.imag[1] = axis[1] * s;
  q.imag[2] = axis[2] * s;
  q.real = c;

  return q;
}